

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texturemanager.cpp
# Opt level: O2

FTextureID __thiscall FTextureManager::PalCheck(FTextureManager *this,FTextureID tex)

{
  int *piVar1;
  
  if (!vid_nopalsubstitutions.Value) {
    piVar1 = TMap<int,_int,_THashTraits<int>,_TValueTraits<int>_>::CheckKey
                       (&this->PalettedVersions,tex.texnum);
    if ((piVar1 != (int *)0x0) && (*piVar1 != 0)) {
      tex.texnum = *piVar1;
    }
  }
  return (FTextureID)tex.texnum;
}

Assistant:

FTextureID FTextureManager::PalCheck(FTextureID tex)
{
	if (vid_nopalsubstitutions) return tex;
	int *newtex = PalettedVersions.CheckKey(tex.GetIndex());
	if (newtex == NULL || *newtex == 0) return tex;
	return *newtex;
}